

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O2

AbstractOutputStream * __thiscall BlurayHelper::createFile(BlurayHelper *this)

{
  ISOFile *pIVar1;
  File *this_00;
  
  if (this->m_isoWriter != (IsoWriter *)0x0) {
    pIVar1 = IsoWriter::createFile(this->m_isoWriter);
    return &pIVar1->super_AbstractOutputStream;
  }
  this_00 = (File *)operator_new(0x38);
  File::File(this_00);
  return &this_00->super_AbstractOutputStream;
}

Assistant:

AbstractOutputStream* BlurayHelper::createFile()
{
    if (m_isoWriter)
        return m_isoWriter->createFile();
    return new File();
}